

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

void __thiscall Corrade::Utility::Arguments::Arguments(Arguments *this,Arguments *other)

{
  (this->_flags)._value = (other->_flags)._value;
  this->_finalOptionalArgument = 0;
  this->_arrayArgument = 0;
  std::__cxx11::string::string((string *)&this->_prefix,(string *)&other->_prefix);
  std::__cxx11::string::string((string *)&this->_command,(string *)&other->_command);
  std::__cxx11::string::string((string *)&this->_help,(string *)&other->_help);
  (this->_entries)._data = (other->_entries)._data;
  (this->_entries)._size = (other->_entries)._size;
  (this->_entries)._deleter = (other->_entries)._deleter;
  (other->_entries)._data = (Entry *)0x0;
  (other->_entries)._size = 0;
  (other->_entries)._deleter = (_func_void_Entry_ptr_unsigned_long *)0x0;
  (this->_values)._data = (other->_values)._data;
  (this->_values)._size = (other->_values)._size;
  (this->_values)._deleter = (other->_values)._deleter;
  (other->_values)._deleter =
       (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_unsigned_long
        *)0x0;
  (other->_values)._data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (other->_values)._size = 0;
  (this->_arrayValues)._deleter =
       (_func_void_Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ptr)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr,_unsigned_long)>_ptr_unsigned_long
        *)0x0;
  (this->_arrayValues)._data =
       (Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_unsigned_long)>
        *)0x0;
  (this->_arrayValues)._size = 0;
  (this->_skippedPrefixes)._data = (other->_skippedPrefixes)._data;
  (this->_skippedPrefixes)._size = (other->_skippedPrefixes)._size;
  (this->_skippedPrefixes)._deleter = (other->_skippedPrefixes)._deleter;
  (other->_skippedPrefixes)._data =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  (other->_skippedPrefixes)._size = 0;
  (other->_skippedPrefixes)._deleter =
       (_func_void_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr_unsigned_long
        *)0x0;
  (this->_booleans)._data = (other->_booleans)._data;
  (this->_booleans)._size = (other->_booleans)._size;
  (this->_booleans)._deleter = (other->_booleans)._deleter;
  (other->_booleans)._deleter = (_func_void_bool_ptr_unsigned_long *)0x0;
  (other->_booleans)._data = (bool *)0x0;
  (other->_booleans)._size = 0;
  this->_parseErrorCallback = other->_parseErrorCallback;
  this->_parseErrorCallbackState = other->_parseErrorCallbackState;
  (other->_flags)._value = (other->_flags)._value & 0x7f;
  return;
}

Assistant:

Arguments::Arguments(Arguments&& other) noexcept: _flags{std::move(other._flags)}, _prefix{std::move(other._prefix)}, _command{std::move(other._command)}, _help{std::move(other._help)}, _entries{std::move(other._entries)}, _values{std::move(other._values)}, _skippedPrefixes{std::move(other._skippedPrefixes)}, _booleans{std::move(other._booleans)}, _parseErrorCallback{std::move(other._parseErrorCallback)}, _parseErrorCallbackState{std::move(other._parseErrorCallbackState)} {
    other._flags &= ~InternalFlag::Parsed;
}